

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

RegOpnd * __thiscall
Lowerer::GenerateArrayTest
          (Lowerer *this,RegOpnd *baseOpnd,LabelInstr *isNotObjectLabel,LabelInstr *isNotArrayLabel,
          Instr *insertBeforeInstr,bool forceFloat,bool isStore,bool allowDefiniteArray)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  ValueType valueType;
  VTableValue vtableType;
  int iVar4;
  undefined4 *puVar5;
  Lowerer *pLVar6;
  IntConstOpnd *testSrc2;
  RegOpnd *pRVar7;
  Opnd *pOVar8;
  LabelInstr *pLVar9;
  IndirOpnd *pIVar10;
  BranchInstr *pBVar11;
  LabelInstr *instr;
  undefined4 extraout_var;
  MemRefOpnd *src;
  Instr *instr_00;
  Lowerer *pLVar12;
  OptimizationOverridesValue valueType_00;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  VTableValue local_4c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType arrayValueType;
  ValueType baseValueType;
  
  if (baseOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3bdf,"(baseOpnd)","baseOpnd");
    if (!bVar2) goto LAB_005744fd;
    *puVar5 = 0;
  }
  local_32[0] = (baseOpnd->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (bVar2 && !allowDefiniteArray) {
    bVar2 = ValueType::IsNativeArray((ValueType *)&local_32[0].field_0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3be4,
                         "(!baseValueType.IsAnyOptimizedArray() || allowDefiniteArray || baseValueType.IsNativeArray())"
                         ,
                         "!baseValueType.IsAnyOptimizedArray() || allowDefiniteArray || baseValueType.IsNativeArray()"
                        );
      if (!bVar2) goto LAB_005744fd;
      *puVar5 = 0;
    }
  }
  bVar2 = ValueType::IsUninitialized((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    bVar2 = ValueType::HasBeenObject((ValueType *)&local_32[0].field_0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3be5,
                         "(baseValueType.IsUninitialized() || baseValueType.HasBeenObject())",
                         "baseValueType.IsUninitialized() || baseValueType.HasBeenObject()");
      if (!bVar2) goto LAB_005744fd;
      *puVar5 = 0;
    }
  }
  if (isNotObjectLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be7,"(isNotObjectLabel)","isNotObjectLabel");
    if (!bVar2) goto LAB_005744fd;
    *puVar5 = 0;
  }
  if (isNotArrayLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be8,"(isNotArrayLabel)","isNotArrayLabel");
    if (!bVar2) goto LAB_005744fd;
    *puVar5 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be9,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) goto LAB_005744fd;
    *puVar5 = 0;
  }
  func = insertBeforeInstr->m_func;
  local_80 = (undefined1  [8])0x0;
  autoReuseArrayOpnd.func._1_1_ = 1;
  bVar2 = ValueType::IsLikelyObject((ValueType *)&local_32[0].field_0);
  if (bVar2) {
    OVar3 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0);
    if (OVar3 != ObjectWithArray) goto LAB_00573f95;
    pLVar6 = this;
    GenerateObjectTypeTest(this,baseOpnd,insertBeforeInstr,isNotObjectLabel);
    GenerateObjectHeaderInliningTest(pLVar6,baseOpnd,isNotArrayLabel,insertBeforeInstr);
    pLVar6 = (Lowerer *)LoadObjectArray(pLVar6,baseOpnd,insertBeforeInstr);
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_80,(Opnd *)pLVar6,func,false);
    InsertTestBranch((Opnd *)pLVar6,(Opnd *)pLVar6,BrEq_A,isNotArrayLabel,insertBeforeInstr);
    testSrc2 = IR::IntConstOpnd::New(1,TyUint8,func,true);
    InsertTestBranch((Opnd *)pLVar6,&testSrc2->super_Opnd,BrNeq_A,isNotArrayLabel,insertBeforeInstr)
    ;
  }
  else {
LAB_00573f95:
    bVar2 = IR::Opnd::IsNotTaggedValue(&baseOpnd->super_Opnd);
    if (!bVar2) {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&baseOpnd->super_Opnd,insertBeforeInstr,isNotObjectLabel,false);
    }
    pOVar8 = IR::Opnd::Copy(&baseOpnd->super_Opnd,func);
    pLVar6 = (Lowerer *)IR::Opnd::AsRegOpnd(pOVar8);
    bVar2 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_32[0].field_0);
    if (!bVar2) {
      autoReuseArrayOpnd._22_2_ = ValueType::GetObject(Array);
      autoReuseArrayOpnd._20_2_ = ValueType::ToLikely((ValueType *)&autoReuseArrayOpnd.field_0x16);
      local_34.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues((ValueType *)&autoReuseArrayOpnd.field_0x14,false);
      valueType = ValueType::SetArrayTypeId((ValueType *)&local_34.field_0,TypeIds_Array);
      IR::Opnd::SetValueType((Opnd *)pLVar6,valueType);
    }
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_80,(Opnd *)pLVar6,func,false);
  }
  bVar2 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (bVar2) {
    vtableType = GetArrayVtableAddress((ValueType)local_32[0].field_0,false);
  }
  else {
    vtableType = VtableJavascriptArray;
  }
  bVar2 = ValueType::IsLikelyMixedTypedArrayType((ValueType *)&local_32[0].field_0);
  if (bVar2) {
    local_4c = GetArrayVtableAddress((ValueType)local_32[0].field_0,true);
  }
  else {
    local_4c = VtableInvalid;
  }
  if (isStore) {
    if (vtableType != VtableJavascriptArray) {
      bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
      if (!bVar2) goto LAB_005740bc;
    }
    pRVar7 = IR::RegOpnd::New(TyUint64,func);
    bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    valueType_00 = OptimizationOverridesArraySetElementFastPathVtable;
    if (bVar2) {
      bVar2 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
      if (bVar2) {
        valueType_00 = OptimizationOverridesIntArraySetElementFastPathVtable;
      }
      else {
        bVar2 = ValueType::HasFloatElements((ValueType *)&local_32[0].field_0);
        valueType_00 = OptimizationOverridesFloatArraySetElementFastPathVtable;
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x3c34,"(baseValueType.HasFloatElements())",
                             "baseValueType.HasFloatElements()");
          if (!bVar2) goto LAB_005744fd;
          *puVar5 = 0;
        }
      }
    }
    pOVar8 = LoadOptimizationOverridesValueOpnd(this,insertBeforeInstr,valueType_00);
    InsertMove(&pRVar7->super_Opnd,pOVar8,insertBeforeInstr,true);
  }
  else {
LAB_005740bc:
    pRVar7 = (RegOpnd *)LoadVTableValueOpnd(this,insertBeforeInstr,vtableType);
  }
  if (forceFloat) {
    bVar2 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_32[0].field_0);
    if (bVar2) {
      pLVar9 = IR::LabelInstr::New(Label,this->m_func,false);
      pLVar12 = pLVar6;
      pIVar10 = IR::IndirOpnd::New((RegOpnd *)pLVar6,0,TyUint64,func,false);
      pBVar11 = InsertCompareBranch(pLVar12,&pIVar10->super_Opnd,&pRVar7->super_Opnd,BrEq_A,pLVar9,
                                    insertBeforeInstr,false);
      LowererMD::InsertObjectPoison((Opnd *)pLVar6,pBVar11,insertBeforeInstr,isStore);
      instr = IR::LabelInstr::New(Label,this->m_func,true);
      IR::Instr::InsertBefore(insertBeforeInstr,&instr->super_Instr);
      if (isStore) {
        pRVar7 = IR::RegOpnd::New(TyUint64,func);
        iVar4 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x14])();
        src = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar4),TyUint64,func,AddrOpndKindDynamicMisc
                                 );
        InsertMove(&pRVar7->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
      }
      else {
        pRVar7 = (RegOpnd *)
                 LoadVTableValueOpnd(this,insertBeforeInstr,VtableJavascriptNativeIntArray);
      }
      pLVar12 = pLVar6;
      pIVar10 = IR::IndirOpnd::New((RegOpnd *)pLVar6,0,TyUint64,func,false);
      pBVar11 = InsertCompareBranch(pLVar12,&pIVar10->super_Opnd,&pRVar7->super_Opnd,BrNeq_A,
                                    isNotArrayLabel,insertBeforeInstr,false);
      LowererMD::InsertObjectPoison((Opnd *)pLVar6,pBVar11,insertBeforeInstr,isStore);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,insertBeforeInstr,(Opnd *)pLVar6);
      instr_00 = IR::Instr::New(Call,this->m_func);
      IR::Instr::InsertBefore(insertBeforeInstr,instr_00);
      LowererMD::ChangeToHelperCall
                (&this->m_lowererMD,instr_00,HelperIntArr_ToNativeFloatArray,(LabelInstr *)0x0,
                 (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
      InsertBranch(Br,isNotArrayLabel,insertBeforeInstr);
      IR::Instr::InsertBefore(insertBeforeInstr,&pLVar9->super_Instr);
      goto LAB_00574499;
    }
  }
  bVar2 = ValueType::IsLikelyMixedTypedArrayType((ValueType *)&local_32[0].field_0);
  if (bVar2) {
    pLVar9 = IR::LabelInstr::New(Label,this->m_func,false);
    pLVar12 = pLVar6;
    pIVar10 = IR::IndirOpnd::New((RegOpnd *)pLVar6,0,TyUint64,func,false);
    InsertCompareBranch(pLVar12,&pIVar10->super_Opnd,&pRVar7->super_Opnd,BrEq_A,pLVar9,
                        insertBeforeInstr,false);
    if (local_4c == VtableJavascriptNumber) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3c82,"(virtualVtableAddress)","virtualVtableAddress");
      if (!bVar2) goto LAB_005744fd;
      *puVar5 = 0;
    }
    pOVar8 = LoadVTableValueOpnd(this,insertBeforeInstr,local_4c);
    if (pOVar8 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3c84,"(vtableVirtualOpnd)","vtableVirtualOpnd");
      if (!bVar2) {
LAB_005744fd:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pLVar12 = pLVar6;
    pIVar10 = IR::IndirOpnd::New((RegOpnd *)pLVar6,0,TyUint64,func,false);
    pBVar11 = InsertCompareBranch(pLVar12,&pIVar10->super_Opnd,pOVar8,BrNeq_A,isNotArrayLabel,
                                  insertBeforeInstr,false);
    LowererMD::InsertObjectPoison((Opnd *)pLVar6,pBVar11,insertBeforeInstr,isStore);
    IR::Instr::InsertBefore(insertBeforeInstr,&pLVar9->super_Instr);
  }
  else {
    pLVar12 = pLVar6;
    pIVar10 = IR::IndirOpnd::New((RegOpnd *)pLVar6,0,TyUint64,func,false);
    pBVar11 = InsertCompareBranch(pLVar12,&pIVar10->super_Opnd,&pRVar7->super_Opnd,BrNeq_A,
                                  isNotArrayLabel,insertBeforeInstr,false);
    LowererMD::InsertObjectPoison((Opnd *)pLVar6,pBVar11,insertBeforeInstr,isStore);
  }
LAB_00574499:
  local_34 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(pLVar6->m_lowererMD).FloatPrefThreshold;
  bVar2 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_34.field_0);
  if (bVar2) {
    bVar2 = ValueType::IsObject((ValueType *)&local_34.field_0);
    if (!bVar2) {
      local_34.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues((ValueType *)&local_34.field_0,false);
    }
  }
  local_34.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::ToDefiniteObject((ValueType *)&local_34.field_0);
  IR::Opnd::SetValueType((Opnd *)pLVar6,(ValueType)local_34);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
  return (RegOpnd *)pLVar6;
}

Assistant:

IR::RegOpnd *Lowerer::GenerateArrayTest(
    IR::RegOpnd *const baseOpnd,
    IR::LabelInstr *const isNotObjectLabel,
    IR::LabelInstr *const isNotArrayLabel,
    IR::Instr *const insertBeforeInstr,
    const bool forceFloat,
    const bool isStore,
    const bool allowDefiniteArray)
{
    Assert(baseOpnd);

    const ValueType baseValueType(baseOpnd->GetValueType());

    // Shouldn't request to do an array test when it's already known to be an array, or if it's unlikely to be an array
    Assert(!baseValueType.IsAnyOptimizedArray() || allowDefiniteArray || baseValueType.IsNativeArray());
    Assert(baseValueType.IsUninitialized() || baseValueType.HasBeenObject());

    Assert(isNotObjectLabel);
    Assert(isNotArrayLabel);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    IR::RegOpnd *arrayOpnd;
    IR::AutoReuseOpnd autoReuseArrayOpnd;
    if(baseValueType.IsLikelyObject() && baseValueType.GetObjectType() == ObjectType::ObjectWithArray)
    {
        // Only DynamicObject is allowed (DynamicObject vtable is ensured) because some object types have special handling for
        // index properties - arguments object, string object, external object, etc.
        // JavascriptArray::Jit_TryGetArrayForObjectWithArray as well.
        GenerateObjectTypeTest(baseOpnd, insertBeforeInstr, isNotObjectLabel);
        GenerateObjectHeaderInliningTest(baseOpnd, isNotArrayLabel, insertBeforeInstr);
        arrayOpnd = LoadObjectArray(baseOpnd, insertBeforeInstr);
        autoReuseArrayOpnd.Initialize(arrayOpnd, func, false /* autoDelete */);

        // test array, array
        // je   $isNotArrayLabel
        // test array, 1
        // jne  $isNotArrayLabel
        InsertTestBranch(
            arrayOpnd,
            arrayOpnd,
            Js::OpCode::BrEq_A,
            isNotArrayLabel,
            insertBeforeInstr);
        InsertTestBranch(
            arrayOpnd,
            IR::IntConstOpnd::New(1, TyUint8, func, true),
            Js::OpCode::BrNeq_A,
            isNotArrayLabel,
            insertBeforeInstr);
    }
    else
    {
        if(!baseOpnd->IsNotTaggedValue())
        {
            m_lowererMD.GenerateObjectTest(baseOpnd, insertBeforeInstr, isNotObjectLabel);
        }
        arrayOpnd = baseOpnd->Copy(func)->AsRegOpnd();
        if(!baseValueType.IsLikelyAnyOptimizedArray())
        {
            arrayOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array)
                    .ToLikely()
                    .SetHasNoMissingValues(false)
                    .SetArrayTypeId(Js::TypeIds_Array));
        }
        autoReuseArrayOpnd.Initialize(arrayOpnd, func, false /* autoDelete */);
    }

    VTableValue vtableAddress = baseValueType.IsLikelyAnyOptimizedArray()
                ? GetArrayVtableAddress(baseValueType)
                : VTableValue::VtableJavascriptArray;

    VTableValue virtualVtableAddress = VTableValue::VtableInvalid;
    if (baseValueType.IsLikelyMixedTypedArrayType())
    {
        virtualVtableAddress = GetArrayVtableAddress(baseValueType, true);
    }
    IR::Opnd * vtableOpnd;
    IR::Opnd * vtableVirtualOpnd = nullptr;
    if (isStore &&
        (vtableAddress == VTableValue::VtableJavascriptArray ||
         baseValueType.IsLikelyNativeArray()))
    {
        vtableOpnd = IR::RegOpnd::New(TyMachPtr, func);
        if (baseValueType.IsLikelyNativeArray())
        {
            if (baseValueType.HasIntElements())
            {
                InsertMove(vtableOpnd, this->LoadOptimizationOverridesValueOpnd(insertBeforeInstr, OptimizationOverridesValue::OptimizationOverridesIntArraySetElementFastPathVtable), insertBeforeInstr);
            }
            else
            {
                Assert(baseValueType.HasFloatElements());
                InsertMove(vtableOpnd, this->LoadOptimizationOverridesValueOpnd(insertBeforeInstr, OptimizationOverridesValue::OptimizationOverridesFloatArraySetElementFastPathVtable), insertBeforeInstr);
            }
        }
        else
        {
            InsertMove(vtableOpnd, this->LoadOptimizationOverridesValueOpnd(insertBeforeInstr, OptimizationOverridesValue::OptimizationOverridesArraySetElementFastPathVtable), insertBeforeInstr);
        }
    }
    else
    {
        vtableOpnd = LoadVTableValueOpnd(insertBeforeInstr, vtableAddress);
    }

    // cmp  [array], vtableAddress
    // jne  $isNotArrayLabel

    if (forceFloat && baseValueType.IsLikelyNativeFloatArray())
    {
        // We expect a native float array. If we get native int instead, convert it on the spot and bail out afterward.
        const auto goodArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        IR::BranchInstr* branchInstr = InsertCompareBranch(
            IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
            vtableOpnd,
            Js::OpCode::BrEq_A,
            goodArrayLabel,
            insertBeforeInstr);

        InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);

        IR::LabelInstr *notFloatArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        insertBeforeInstr->InsertBefore(notFloatArrayLabel);

        if (isStore)
        {
            vtableOpnd = IR::RegOpnd::New(TyMachPtr, func);
            InsertMove(vtableOpnd, IR::MemRefOpnd::New(
                           func->GetScriptContextInfo()->GetIntArraySetElementFastPathVtableAddr(),
                           TyMachPtr, func), insertBeforeInstr);
        }
        else
        {
            vtableOpnd = LoadVTableValueOpnd(insertBeforeInstr, VTableValue::VtableJavascriptNativeIntArray);
        }

        branchInstr = InsertCompareBranch(
            IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
            vtableOpnd,
            Js::OpCode::BrNeq_A,
            isNotArrayLabel,
            insertBeforeInstr);

        InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);

        m_lowererMD.LoadHelperArgument(insertBeforeInstr, arrayOpnd);

        IR::Instr *helperInstr = IR::Instr::New(Js::OpCode::Call, m_func);
        insertBeforeInstr->InsertBefore(helperInstr);
        m_lowererMD.ChangeToHelperCall(helperInstr, IR::HelperIntArr_ToNativeFloatArray);

        // Branch to the (bailout) label, because converting the array may have made our array checks unsafe.
        InsertBranch(Js::OpCode::Br, isNotArrayLabel, insertBeforeInstr);

        insertBeforeInstr->InsertBefore(goodArrayLabel);
    }
    else
    {
        IR::LabelInstr* goodArrayLabel = nullptr;
        if (baseValueType.IsLikelyMixedTypedArrayType())
        {
            goodArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
            InsertCompareBranch(
                IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
                vtableOpnd,
                Js::OpCode::BrEq_A,
                goodArrayLabel,
                insertBeforeInstr);
            Assert(virtualVtableAddress);
            vtableVirtualOpnd = LoadVTableValueOpnd(insertBeforeInstr, virtualVtableAddress);
            Assert(vtableVirtualOpnd);
            IR::BranchInstr* branchInstr = InsertCompareBranch(
                IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
                vtableVirtualOpnd,
                Js::OpCode::BrNeq_A,
                isNotArrayLabel,
                insertBeforeInstr);

            InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);
            insertBeforeInstr->InsertBefore(goodArrayLabel);
        }
        else
        {
            IR::BranchInstr *branchInstr = InsertCompareBranch(
                IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
                vtableOpnd,
                Js::OpCode::BrNeq_A,
                isNotArrayLabel,
                insertBeforeInstr);

            InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);
        }

    }

    ValueType arrayValueType(arrayOpnd->GetValueType());
    if(arrayValueType.IsLikelyArrayOrObjectWithArray() && !arrayValueType.IsObject())
    {
        arrayValueType = arrayValueType.SetHasNoMissingValues(false);
    }
    arrayValueType = arrayValueType.ToDefiniteObject();
    arrayOpnd->SetValueType(arrayValueType);
    return arrayOpnd;
}